

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<std::complex<long_double>_>::GetSub
          (TPZMatrix<std::complex<long_double>_> *this,TPZVec<long> *indices,
          TPZFMatrix<std::complex<long_double>_> *block)

{
  long lVar1;
  long lVar2;
  complex<long_double> *pcVar3;
  long col;
  long row;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  lVar1 = indices->fNElements;
  row = 0;
  lVar2 = 0;
  if (0 < lVar1) {
    lVar2 = lVar1;
  }
  for (; row != lVar2; row = row + 1) {
    for (col = 0; lVar1 != col; col = col + 1) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_58,this,indices->fStore[row],indices->fStore[col]);
      pcVar3 = TPZFMatrix<std::complex<long_double>_>::operator()(block,row,col);
      *(undefined8 *)pcVar3->_M_value = local_58;
      *(undefined8 *)(pcVar3->_M_value + 8) = uStack_50;
      *(undefined8 *)(pcVar3->_M_value + 0x10) = local_48;
      *(undefined8 *)(pcVar3->_M_value + 0x18) = uStack_40;
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::GetSub(const TPZVec<int64_t> &indices,TPZFMatrix<TVar> &block) const
{
    int64_t nel = indices.NElements();
    int64_t iel,jel;
    for(iel=0; iel<nel; iel++)
    {
		for(jel=0; jel<nel; jel++)
		{
			block(iel,jel) = GetVal(indices[iel],indices[jel]);
		}
    }
	
}